

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator~(CharClass<char> *__return_storage_ptr__,CharClass<char> *this)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  pointer pRVar5;
  char local_69;
  Range<char> *local_68;
  char local_59;
  __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
  local_58;
  Range<char> *local_50;
  __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
  local_38;
  byte local_29;
  const_iterator cStack_28;
  char last_end;
  const_iterator i;
  CharClass<char> *this_local;
  CharClass<char> *cc;
  
  i._M_current._7_1_ = 0;
  CharClass(__return_storage_ptr__);
  cStack_28 = std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::cbegin
                        (&this->m_ranges);
  local_29 = 1;
  local_38._M_current =
       (Range<char> *)
       std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::cend
                 (&this->m_ranges);
  bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffd8,&local_38);
  if (bVar2) {
    pRVar5 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    cVar3 = Range<char>::start(pRVar5);
    if (cVar3 == '\x01') {
      pRVar5 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
               ::operator->(&stack0xffffffffffffffd8);
      local_29 = Range<char>::end(pRVar5);
      local_50 = (Range<char> *)
                 __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                 ::operator++(&stack0xffffffffffffffd8,0);
    }
  }
  while( true ) {
    local_58._M_current =
         (Range<char> *)
         std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::cend
                   (&this->m_ranges);
    bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffd8,&local_58);
    bVar1 = local_29;
    if (!bVar2) break;
    pRVar5 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    local_59 = Range<char>::start(pRVar5);
    std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
    emplace_back<char&,char>
              ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)
               &__return_storage_ptr__->m_ranges,(char *)&local_29,&local_59);
    pRVar5 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    local_29 = Range<char>::end(pRVar5);
    local_68 = (Range<char> *)
               __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
               ::operator++(&stack0xffffffffffffffd8,0);
  }
  bVar4 = std::numeric_limits<char>::max();
  if (bVar1 < bVar4) {
    local_69 = std::numeric_limits<char>::max();
    std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
    emplace_back<char&,char>
              ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)
               &__return_storage_ptr__->m_ranges,(char *)&local_29,&local_69);
  }
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator~() const
    {
        CharClass<TCHAR> cc;

		typename std::vector<Range<TCHAR> >::const_iterator i = m_ranges.cbegin();
		TCHAR last_end = 1;

		if (i != m_ranges.cend())
		{
			if (i->start() == 1)
			{
				last_end = i->end();
				i++;
			}
		}

		for (; i != m_ranges.cend(); i++)
		{
			cc.m_ranges.emplace_back(last_end, i->start());
			last_end = i->end();
		}

		if (last_end < std::numeric_limits<TCHAR>::max())
			cc.m_ranges.emplace_back(last_end, std::numeric_limits<TCHAR>::max());

        return cc;
    }